

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadTiles(string *tempdir)

{
  int iVar1;
  uint uVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s_00;
  ostream *poVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  exr_decode_pipeline_t *in_RCX;
  char *pcVar5;
  int unaff_EBP;
  char *pcVar6;
  char *pcVar7;
  exr_context_t f;
  int levelsy;
  int levelsx;
  int32_t ccount;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> gptr;
  exr_storage_t ps;
  uint64_t pchunksz;
  exr_chunk_info_t cinfo;
  string fn;
  void *local_268;
  code *local_260;
  void *local_258;
  size_t sStack_250;
  void *local_248;
  size_t sStack_240;
  int32_t *local_238;
  size_t sStack_230;
  void *local_228;
  size_t sStack_220;
  void *local_218;
  size_t sStack_210;
  _func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *local_208;
  exr_decode_pipeline_t decoder;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&decoder);
  local_218 = (void *)0x0;
  local_228 = (void *)0x0;
  sStack_220 = 0;
  local_238 = (int32_t *)0x0;
  sStack_230 = 0;
  local_248 = (void *)0x0;
  sStack_240 = 0;
  local_258 = (void *)0x0;
  sStack_250 = 0;
  local_208 = (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0;
  local_268 = (void *)0x68;
  sStack_210 = 0xbf800000fffffffe;
  local_260 = err_cb;
  std::__cxx11::string::append((char *)&fn);
  iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_268);
  if (iVar1 == 0) {
    iVar1 = exr_get_storage(f,0,&ps);
    if (iVar1 != 0) goto LAB_0012e5fc;
    if (ps != EXR_STORAGE_TILED) goto LAB_0012e65d;
    iVar1 = exr_get_chunk_count(0,0,&ccount);
    if (iVar1 != 2) goto LAB_0012e675;
    uVar2 = exr_get_chunk_count(f,0xffffffffffffffff,&ccount);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012e715;
    uVar2 = exr_get_chunk_count(f,0xb,&ccount);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012e7b5;
    uVar2 = exr_get_chunk_count(f,0,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 3) goto LAB_0012e855;
    uVar2 = exr_get_chunk_count(f,0,&ccount);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012e8f5;
    iVar1 = exr_get_scanlines_per_chunk(f,0,&ccount);
    if (iVar1 != 0x12) goto LAB_0012e956;
    levelsx = -1;
    in_RCX = (exr_decode_pipeline_t *)&levelsy;
    levelsy = -1;
    uVar2 = exr_get_tile_levels(0,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 2) goto LAB_0012e9f6;
    pcVar7 = "levelsx == -1";
    if (levelsx != -1) goto LAB_0012ea96;
    pcVar7 = "levelsy == -1";
    if (levelsy != -1) {
      pcVar6 = (char *)0x191;
      goto LAB_0012f170;
    }
    in_RCX = (exr_decode_pipeline_t *)&levelsy;
    unaff_EBP = exr_get_tile_levels(f,1,&levelsx);
    if (unaff_EBP != 4) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
      poVar4 = std::operator<<(poVar4,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_levels (f, 1, &levelsx, &levelsy)",(char *)0x195,0x157bbb,
                     (char *)in_RCX);
LAB_0012eb4a:
      pcVar7 = (char *)poVar4;
      pcVar6 = (char *)0x196;
      goto LAB_0012f170;
    }
    poVar4 = (ostream *)"levelsx == -1";
    if (levelsx != -1) goto LAB_0012eb4a;
    if (levelsy != -1) {
      pcVar6 = (char *)0x197;
      goto LAB_0012f170;
    }
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar2 = exr_get_tile_levels(f,0,0);
    if (uVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(uVar2);
      poVar4 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_levels (f, 0, __null, __null)",(char *)0x199,0x157bbb,
                     (char *)in_RCX);
LAB_0012ebbf:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message((ostream *)(ulong)uVar2);
      poVar4 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, __null)",(char *)0x19c,0x157bbb,
                     (char *)in_RCX);
      poVar4 = (ostream *)(ulong)uVar2;
LAB_0012ec20:
      pcVar7 = (char *)poVar4;
      pcVar6 = (char *)0x19d;
      goto LAB_0012f170;
    }
    levelsx = -1;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar2 = exr_get_tile_levels(f,0);
    if (uVar2 != 0) goto LAB_0012ebbf;
    poVar4 = (ostream *)"levelsx == 1";
    if (levelsx != 1) goto LAB_0012ec20;
    in_RCX = (exr_decode_pipeline_t *)&levelsy;
    levelsy = -1;
    unaff_EBP = exr_get_tile_levels(f,0,0);
    if (unaff_EBP != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar6 = (char *)exr_get_default_error_message(unaff_EBP);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_levels (f, 0, __null, &levelsy)",(char *)0x1a0,0x157bbb,
                     (char *)in_RCX);
LAB_0012ec8b:
      pcVar6 = (char *)0x1a1;
      goto LAB_0012f170;
    }
    pcVar7 = "levelsy == 1";
    if (levelsy != 1) goto LAB_0012ec8b;
    in_RCX = (exr_decode_pipeline_t *)&levelsy;
    levelsy = -1;
    levelsx = -1;
    unaff_EBP = exr_get_tile_levels(f,0);
    if (unaff_EBP != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, &levelsy)",(char *)0x1a4,0x157bbb,
                     (char *)in_RCX);
LAB_0012ecf6:
      pcVar7 = (char *)poVar4;
      pcVar6 = (char *)0x1a5;
      goto LAB_0012f170;
    }
    if (levelsx != 1) goto LAB_0012ecf6;
    if (levelsy != 1) {
      pcVar6 = (char *)0x1a6;
      goto LAB_0012f170;
    }
    in_RCX = (exr_decode_pipeline_t *)0x0;
    iVar1 = exr_get_tile_sizes(0,0,0,0,0,0);
    if (iVar1 != 2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(iVar1);
      poVar4 = std::operator<<(poVar4,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(2);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_sizes (__null, 0, 0, 0, __null, __null)",(char *)0x1aa,0x157bbb,
                     (char *)in_RCX);
LAB_0012edaa:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar4 = std::operator<<(poVar3,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy)",(char *)0x1ad,0x157bbb,
                     (char *)in_RCX);
LAB_0012ee4a:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar4 = std::operator<<(poVar3,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy)",(char *)0x1b0,0x157bbb,
                     (char *)in_RCX);
LAB_0012eeea:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar4 = std::operator<<(poVar3,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(4);
      poVar3 = std::operator<<(poVar4,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy)",(char *)0x1b3,0x157bbb,
                     (char *)in_RCX);
LAB_0012ef8a:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
      poVar4 = std::operator<<(poVar3,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
      pcVar7 = (char *)std::operator<<(poVar4,") ");
      pcVar6 = (char *)exr_get_default_error_message(4);
      poVar4 = std::operator<<((ostream *)pcVar7,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy)",(char *)0x1b6,0x157bbb,
                     (char *)in_RCX);
LAB_0012f02a:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)pcVar7);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar6 = (char *)exr_get_default_error_message((ulong)pcVar7 & 0xffffffff);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy)",(char *)0x1b7,0x157bbb,
                     (char *)in_RCX);
LAB_0012f08b:
      pcVar6 = (char *)0x1b8;
      goto LAB_0012f170;
    }
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar2 = exr_get_tile_sizes(f,0,0xffffffffffffffff,0,&levelsx,&levelsy);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012edaa;
    in_RCX = (exr_decode_pipeline_t *)0xffffffffffffffff;
    uVar2 = exr_get_tile_sizes(f,0,0,0xffffffffffffffff,&levelsx,&levelsy);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012ee4a;
    in_RCX = (exr_decode_pipeline_t *)0x64;
    uVar2 = exr_get_tile_sizes(f,0,0,100,&levelsx,&levelsy);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012eeea;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar2 = exr_get_tile_sizes(f,0,100,0,&levelsx,&levelsy);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 4) goto LAB_0012ef8a;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar2 = exr_get_tile_sizes(f,0,0,0,&levelsx,&levelsy);
    pcVar7 = (char *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f02a;
    pcVar5 = "levelsx == 12";
    pcVar7 = pcVar5;
    if (levelsx != 0xc) goto LAB_0012f08b;
    pcVar7 = "levelsy == 24";
    if (levelsy != 0x18) {
      pcVar6 = (char *)0x1b9;
      goto LAB_0012f170;
    }
    levelsx = -1;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    unaff_EBP = exr_get_tile_sizes(f,0,0,0,&levelsx,0);
    if (unaff_EBP != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
      pcVar5 = (char *)std::operator<<(poVar4,") ");
      pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
      poVar4 = std::operator<<((ostream *)pcVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, __null)",(char *)0x1bb,0x157bbb,
                     (char *)in_RCX);
LAB_0012f100:
      pcVar6 = (char *)0x1bc;
      pcVar7 = pcVar5;
      goto LAB_0012f170;
    }
    if (levelsx != 0xc) goto LAB_0012f100;
    levelsy = -1;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    iVar1 = exr_get_tile_sizes(f,0,0,0,0);
    if (iVar1 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      pcVar7 = (char *)std::operator<<(poVar4,") ");
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      poVar4 = std::operator<<((ostream *)pcVar7,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, __null, &levelsy)",(char *)0x1be,0x157bbb,
                     (char *)in_RCX);
LAB_0012f168:
      pcVar6 = (char *)0x1bf;
      goto LAB_0012f170;
    }
    if (levelsy != 0x18) goto LAB_0012f168;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    unaff_EBP = exr_read_scanline_chunk_info(f,0,0x2a);
    if (unaff_EBP != 0x12) goto LAB_0012f17f;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info(0,0,4,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 2) goto LAB_0012f21f;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info
                          (f,0xffffffffffffffff,4,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 4) goto LAB_0012f2bf;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info(f,1,4,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 4) goto LAB_0012f35f;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info(f,0,4,2,0,0,0);
    if (unaff_EBP != 3) goto LAB_0012f3ff;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info
                          (f,0,4,2,0,0xffffffffffffffff,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 3) goto LAB_0012f49f;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info
                          (f,0,4,2,0xffffffffffffffff,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 3) goto LAB_0012f53f;
    in_RCX = (exr_decode_pipeline_t *)0xfffffffffffffffe;
    unaff_EBP = exr_read_tile_chunk_info
                          (f,0,4,0xfffffffffffffffe,0,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 3) goto LAB_0012f5df;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    unaff_EBP = exr_read_tile_chunk_info
                          (f,0,0xfffffffffffffffc,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    if (unaff_EBP != 3) goto LAB_0012f67f;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    uVar2 = exr_read_tile_chunk_info(f,0,4,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f71f;
    pchunksz = 0;
    uVar2 = exr_get_chunk_unpacked_size(f,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f780;
    if (cinfo.type != '\x01') goto LAB_0012f7e1;
    if (cinfo.compression != '\0') {
      pcVar7 = (char *)0x1e4;
      pcVar6 = "cinfo.compression == EXR_COMPRESSION_NONE";
      goto LAB_0012f833;
    }
    if (cinfo.packed_size != pchunksz) {
      pcVar7 = (char *)0x1e5;
      pcVar6 = "cinfo.packed_size == pchunksz";
      goto LAB_0012f833;
    }
    if (cinfo.unpacked_size != cinfo.packed_size) {
      pcVar7 = (char *)0x1e6;
      pcVar6 = "cinfo.unpacked_size == pchunksz";
      goto LAB_0012f833;
    }
    if (cinfo.sample_count_data_offset != 0) {
      pcVar7 = (char *)0x1e7;
      pcVar6 = "cinfo.sample_count_data_offset == 0";
      goto LAB_0012f833;
    }
    if (cinfo.sample_count_table_size != 0) {
      pcVar7 = (char *)0x1e8;
      pcVar6 = "cinfo.sample_count_table_size == 0";
      goto LAB_0012f833;
    }
    in_RCX = &decoder;
    uVar2 = exr_decoding_initialize(f,0,&cinfo);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f83f;
    if (decoder.channel_count != 2) goto LAB_0012f8a0;
    pcVar7 = (char *)0x1ee;
    pcVar6 = "!strcmp (decoder.channels[0].channel_name, \"G\")";
    if ((*(decoder.channels)->channel_name != 'G') || ((decoder.channels)->channel_name[1] != '\0'))
    goto LAB_0012f93b;
    if ((decoder.channels)->bytes_per_element != '\x02') {
      pcVar7 = (char *)0x1ef;
      pcVar6 = "decoder.channels[0].bytes_per_element == 2";
      goto LAB_0012f93b;
    }
    if ((decoder.channels)->width != 0xc) {
      pcVar7 = (char *)0x1f0;
      pcVar6 = "decoder.channels[0].width == 12";
      goto LAB_0012f93b;
    }
    if ((decoder.channels)->height != 0x18) {
      pcVar7 = (char *)0x1f1;
      pcVar6 = "decoder.channels[0].height == 24";
      goto LAB_0012f93b;
    }
    if ((decoder.channels)->x_samples != 1) {
      pcVar7 = (char *)0x1f2;
      pcVar6 = "decoder.channels[0].x_samples == 1";
      goto LAB_0012f93b;
    }
    if ((decoder.channels)->y_samples != 1) {
      pcVar7 = (char *)0x1f3;
      pcVar6 = "decoder.channels[0].y_samples == 1";
      goto LAB_0012f93b;
    }
    pcVar7 = (char *)0x1f4;
    pcVar6 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
    if ((*decoder.channels[1].channel_name != 'Z') || (decoder.channels[1].channel_name[1] != '\0'))
    goto LAB_0012f93b;
    if (decoder.channels[1].bytes_per_element != '\x04') {
      pcVar7 = (char *)0x1f5;
      pcVar6 = "decoder.channels[1].bytes_per_element == 4";
      goto LAB_0012f93b;
    }
    if (decoder.channels[1].width != 0xc) {
      pcVar7 = (char *)0x1f6;
      pcVar6 = "decoder.channels[1].width == 12";
      goto LAB_0012f93b;
    }
    if (decoder.channels[1].height != 0x18) {
      pcVar7 = (char *)0x1f7;
      pcVar6 = "decoder.channels[1].height == 24";
      goto LAB_0012f93b;
    }
    if (decoder.channels[1].x_samples != 1) {
      pcVar7 = (char *)0x1f8;
      pcVar6 = "decoder.channels[1].x_samples == 1";
      goto LAB_0012f93b;
    }
    if (decoder.channels[1].y_samples != 1) {
      pcVar7 = (char *)0x1f9;
      pcVar6 = "decoder.channels[1].y_samples == 1";
      goto LAB_0012f93b;
    }
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0x240);
    gptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0x480);
    zptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x240);
    memset((void *)__s_00.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x480);
    ((decoder.channels)->field_12).decode_to_ptr =
         (uint8_t *)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (decoder.channels)->user_pixel_stride = 2;
    (decoder.channels)->user_line_stride = 0x18;
    (decoder.channels)->user_bytes_per_element = 2;
    decoder.channels[1].field_12.decode_to_ptr =
         (uint8_t *)
         __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    decoder.channels[1].user_pixel_stride = 4;
    decoder.channels[1].user_line_stride = 0x30;
    decoder.channels[1].user_bytes_per_element = 4;
    uVar2 = exr_decoding_choose_default_routines(f,0,&decoder);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f947;
    uVar2 = exr_decoding_run(f,0,&decoder);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012f9a8;
    iVar1 = 0;
    if (decoder.packed_buffer != (void *)0x0) goto LAB_0012fa09;
    if (decoder.unpacked_buffer != (void *)0x0) {
      pcVar7 = (char *)0x20f;
      pcVar6 = "decoder.unpacked_buffer == __null";
      goto LAB_0012fa23;
    }
    if (*(short *)gptr._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0x33d5)
    goto LAB_0012fa2f;
    if (ABS(*(float *)zptr._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + -0.244778) <
        1e-06) {
      iVar1 = exr_decoding_destroy(f,&decoder);
      if (iVar1 == 0) {
        exr_finish(&f);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&zptr);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&gptr);
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_0012fa55;
    }
    pcVar7 = (char *)0x214;
    pcVar6 = "fabsf (*curz - 0.244778f) < 0.000001f";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x178,0x157bbb,(char *)in_RCX)
    ;
LAB_0012e5fc:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_storage (f, 0, &ps)",(char *)0x17b,0x157bbb,(char *)in_RCX);
LAB_0012e65d:
    core_test_fail("EXR_STORAGE_TILED == ps",(char *)0x17c,0x157bbb,(char *)in_RCX);
LAB_0012e675:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0x180,0x157bbb,(char *)in_RCX)
    ;
LAB_0012e715:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0x182,0x157bbb,(char *)in_RCX);
LAB_0012e7b5:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0x184,0x157bbb,(char *)in_RCX);
LAB_0012e855:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0x186,0x157bbb,(char *)in_RCX);
LAB_0012e8f5:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar1 = (int)poVar4;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0x187,0x157bbb,(char *)in_RCX);
LAB_0012e956:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x12);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(0x12);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0x18a,0x157bbb,
                   (char *)in_RCX);
LAB_0012e9f6:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    pcVar7 = (char *)std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<((ostream *)pcVar7,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_tile_levels (__null, 0, &levelsx, &levelsy)",(char *)0x18f,0x157bbb,
                   (char *)in_RCX);
LAB_0012ea96:
    pcVar6 = (char *)0x190;
LAB_0012f170:
    core_test_fail(pcVar7,pcVar6,0x157bbb,(char *)in_RCX);
LAB_0012f17f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x12);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(0x12);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, &cinfo)",(char *)0x1c4,0x157bbb,
                   (char *)in_RCX);
LAB_0012f21f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (__null, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1c8,0x157bbb
                   ,(char *)in_RCX);
LAB_0012f2bf:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo)",(char *)0x1cb,0x157bbb,
                   (char *)in_RCX);
LAB_0012f35f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo)",(char *)0x1ce,0x157bbb,
                   (char *)in_RCX);
LAB_0012f3ff:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, __null)",(char *)0x1d1,0x157bbb,
                   (char *)in_RCX);
LAB_0012f49f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo)",(char *)0x1d4,0x157bbb,
                   (char *)in_RCX);
LAB_0012f53f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo)",(char *)0x1d7,0x157bbb,
                   (char *)in_RCX);
LAB_0012f5df:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo)",(char *)0x1da,0x157bbb,
                   (char *)in_RCX);
LAB_0012f67f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,unaff_EBP);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(unaff_EBP);
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo)",(char *)0x1dd,0x157bbb,
                   (char *)in_RCX);
LAB_0012f71f:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1e0,0x157bbb,
                   (char *)in_RCX);
LAB_0012f780:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x1e2,0x157bbb,
                   (char *)in_RCX);
LAB_0012f7e1:
    pcVar7 = (char *)0x1e3;
    pcVar6 = "cinfo.type == EXR_STORAGE_TILED";
LAB_0012f833:
    core_test_fail(pcVar6,pcVar7,0x157bbb,(char *)in_RCX);
LAB_0012f83f:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x1eb,0x157bbb,
                   (char *)in_RCX);
LAB_0012f8a0:
    pcVar7 = (char *)0x1ed;
    pcVar6 = "decoder.channel_count == 2";
LAB_0012f93b:
    core_test_fail(pcVar6,pcVar7,0x157bbb,(char *)in_RCX);
LAB_0012f947:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x208,0x157bbb,
                   (char *)in_RCX);
LAB_0012f9a8:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar1 = (int)poVar4;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar7 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x20a,0x157bbb,(char *)in_RCX);
LAB_0012fa09:
    pcVar7 = (char *)0x20d;
    pcVar6 = "decoder.packed_buffer == __null";
LAB_0012fa23:
    core_test_fail(pcVar6,pcVar7,0x157bbb,(char *)in_RCX);
LAB_0012fa2f:
    pcVar7 = (char *)0x213;
    pcVar6 = "*curg == 0x33d5";
  }
  core_test_fail(pcVar6,pcVar7,0x157bbb,(char *)in_RCX);
LAB_0012fa55:
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar7 = (char *)exr_get_default_error_message(iVar1);
  poVar4 = std::operator<<(poVar4,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar4);
  core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x21c,0x157bbb,(char *)in_RCX);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&gptr);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    exr_storage_t ps;
    EXRCORE_TEST_RVAL (exr_get_storage (f, 0, &ps));
    EXRCORE_TEST (EXR_STORAGE_TILED == ps);

    int32_t ccount;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_chunk_count (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_chunk_count (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_chunk_count (f, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_SCAN_TILE_MIXEDAPI,
        exr_get_scanlines_per_chunk (f, 0, &ccount));

    int levelsx = -1, levelsy = -1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_levels (NULL, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == -1);
    EXRCORE_TEST (levelsy == -1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_levels (f, 1, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == -1);
    EXRCORE_TEST (levelsy == -1);

    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, NULL, NULL));

    levelsx = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &levelsx, NULL));
    EXRCORE_TEST (levelsx == 1);

    levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, NULL, &levelsy));
    EXRCORE_TEST (levelsy == 1);

    levelsx = levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == 1);
    EXRCORE_TEST (levelsy == 1);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_tile_sizes (NULL, 0, 0, 0, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy));
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy));
    EXRCORE_TEST (levelsx == 12);
    EXRCORE_TEST (levelsy == 24);
    levelsx = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &levelsx, NULL));
    EXRCORE_TEST (levelsx == 12);
    levelsy = -1;
    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, NULL, &levelsy));
    EXRCORE_TEST (levelsy == 24);

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_SCAN_TILE_MIXEDAPI,
        exr_read_scanline_chunk_info (f, 0, 42, &cinfo));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_read_tile_chunk_info (NULL, 0, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo));

    // actually read a tile...
    EXRCORE_TEST_RVAL (exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));
    uint64_t pchunksz = 0;
    EXRCORE_TEST_RVAL (exr_get_chunk_unpacked_size (f, 0, &pchunksz));
    EXRCORE_TEST (cinfo.type == EXR_STORAGE_TILED);
    EXRCORE_TEST (cinfo.compression == EXR_COMPRESSION_NONE);
    EXRCORE_TEST (cinfo.packed_size == pchunksz);
    EXRCORE_TEST (cinfo.unpacked_size == pchunksz);
    EXRCORE_TEST (cinfo.sample_count_data_offset == 0);
    EXRCORE_TEST (cinfo.sample_count_table_size == 0);

    exr_decode_pipeline_t decoder;
    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

    EXRCORE_TEST (decoder.channel_count == 2);
    EXRCORE_TEST (!strcmp (decoder.channels[0].channel_name, "G"));
    EXRCORE_TEST (decoder.channels[0].bytes_per_element == 2);
    EXRCORE_TEST (decoder.channels[0].width == 12);
    EXRCORE_TEST (decoder.channels[0].height == 24);
    EXRCORE_TEST (decoder.channels[0].x_samples == 1);
    EXRCORE_TEST (decoder.channels[0].y_samples == 1);
    EXRCORE_TEST (!strcmp (decoder.channels[1].channel_name, "Z"));
    EXRCORE_TEST (decoder.channels[1].bytes_per_element == 4);
    EXRCORE_TEST (decoder.channels[1].width == 12);
    EXRCORE_TEST (decoder.channels[1].height == 24);
    EXRCORE_TEST (decoder.channels[1].x_samples == 1);
    EXRCORE_TEST (decoder.channels[1].y_samples == 1);

    std::unique_ptr<uint8_t[]> gptr{new uint8_t[24 * 12 * 2]};
    std::unique_ptr<uint8_t[]> zptr{new uint8_t[24 * 12 * 4]};
    memset (gptr.get (), 0, 24 * 12 * 2);
    memset (zptr.get (), 0, 24 * 12 * 4);
    decoder.channels[0].decode_to_ptr          = gptr.get ();
    decoder.channels[0].user_pixel_stride      = 2;
    decoder.channels[0].user_line_stride       = 2 * 12;
    decoder.channels[0].user_bytes_per_element = 2;
    decoder.channels[1].decode_to_ptr          = zptr.get ();
    decoder.channels[1].user_pixel_stride      = 4;
    decoder.channels[1].user_line_stride       = 4 * 12;
    decoder.channels[1].user_bytes_per_element = 4;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    // it is compression: none
    EXRCORE_TEST (decoder.packed_buffer == NULL);
    // it is compression: none
    EXRCORE_TEST (decoder.unpacked_buffer == NULL);
    /* TODO: add actual comparison against C++ library */
    const uint16_t* curg = reinterpret_cast<const uint16_t*> (gptr.get ());
    const float*    curz = reinterpret_cast<const float*> (zptr.get ());
    EXRCORE_TEST (*curg == 0x33d5);
    EXRCORE_TEST (fabsf (*curz - 0.244778f) < 0.000001f);
    //for ( int y = 0; y < 24; ++y )
    //{
    //    for ( int x = 0; x < 12; ++x )
    //        std::cout << ' ' << std::hex << std::setw( 4 ) << std::setfill( '0' ) << *curg++ << std::dec << " (" << *curz++ << " )";
    //    std::cout << std::endl;
    //}

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
    exr_finish (&f);
}